

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,int n)

{
  ImU32 IVar1;
  uint *puVar2;
  undefined4 in_ESI;
  ImGuiID id;
  ImGuiID seed;
  undefined4 in_stack_fffffffffffffff0;
  
  puVar2 = ImVector<unsigned_int>::back
                     ((ImVector<unsigned_int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  IVar1 = ImHashData(&stack0xfffffffffffffff4,4,*puVar2);
  return IVar1;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(int n)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&n, sizeof(n), seed);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO(id, ImGuiDataType_S32, (intptr_t)n);
#endif
    return id;
}